

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ONX_ErrorCounter * __thiscall
ONX_ErrorCounter::operator+
          (ONX_ErrorCounter *__return_storage_ptr__,ONX_ErrorCounter *this,ONX_ErrorCounter *rhs)

{
  uint local_38;
  uint local_34;
  ONX_ErrorCounter *sum;
  ONX_ErrorCounter *rhs_local;
  ONX_ErrorCounter *this_local;
  
  ONX_ErrorCounter(__return_storage_ptr__);
  __return_storage_ptr__->m_failure_count = this->m_failure_count + rhs->m_failure_count;
  __return_storage_ptr__->m_error_count = this->m_error_count + rhs->m_error_count;
  __return_storage_ptr__->m_warning_count = this->m_warning_count + rhs->m_warning_count;
  __return_storage_ptr__->m_state_bit_field = this->m_state_bit_field | rhs->m_state_bit_field;
  if (this->m_opennurbs_library_error_count < rhs->m_opennurbs_library_error_count) {
    local_34 = rhs->m_opennurbs_library_error_count;
  }
  else {
    local_34 = this->m_opennurbs_library_error_count;
  }
  __return_storage_ptr__->m_opennurbs_library_error_count = local_34;
  if (this->m_opennurbs_library_warning_count < rhs->m_opennurbs_library_warning_count) {
    local_38 = rhs->m_opennurbs_library_warning_count;
  }
  else {
    local_38 = this->m_opennurbs_library_warning_count;
  }
  __return_storage_ptr__->m_opennurbs_library_warning_count = local_38;
  return __return_storage_ptr__;
}

Assistant:

const ONX_ErrorCounter ONX_ErrorCounter::operator+ (
  const ONX_ErrorCounter& rhs
  )
{
  ONX_ErrorCounter sum;
  sum.m_failure_count = m_failure_count + rhs.m_failure_count;
  sum.m_error_count = m_error_count + rhs.m_error_count;
  sum.m_warning_count = m_warning_count + rhs.m_warning_count;


  sum.m_state_bit_field = m_state_bit_field | rhs.m_state_bit_field;
  sum.m_opennurbs_library_error_count
    = (m_opennurbs_library_error_count < rhs.m_opennurbs_library_error_count)
    ? rhs.m_opennurbs_library_error_count
    : m_opennurbs_library_error_count;
  sum.m_opennurbs_library_warning_count
    = (m_opennurbs_library_warning_count < rhs.m_opennurbs_library_warning_count)
    ? rhs.m_opennurbs_library_warning_count
    : m_opennurbs_library_warning_count;

  return sum;
}